

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O1

void __thiscall gss::innards::Proof::failure_due_to_pattern_bigger_than_target(Proof *this)

{
  long *plVar1;
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var2;
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  uVar3;
  _Rb_tree_node_base *p_Var4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  bool bVar8;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t,"* failure due to the pattern being bigger than the target\n",0x3a);
  _Var2._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  for (p_Var4 = *(_Base_ptr *)((long)&(_Var2._M_head_impl)->injectivity_constraints + 0x18);
      p_Var4 != (_Rb_tree_node_base *)((long)&(_Var2._M_head_impl)->injectivity_constraints + 8U);
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    recover_injectivity_constraint(this,p_Var4[1]._M_color);
    recover_at_least_one_constraint(this,p_Var4[1]._M_color);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t,"p",1);
  _Var2._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  p_Var6 = *(_Base_ptr *)((long)&(_Var2._M_head_impl)->at_least_one_value_constraints + 0x18);
  p_Var7 = (_Base_ptr)((long)&(_Var2._M_head_impl)->at_least_one_value_constraints + 8);
  if (p_Var6 != p_Var7) {
    bVar8 = true;
    do {
      uVar3._M_t.
      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
      _M_head_impl = (((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                     proof_stream)._M_t;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 uVar3._M_t.
                 super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
                 _M_head_impl," ",1);
      poVar5 = std::ostream::_M_insert<long>
                         ((long)uVar3._M_t.
                                super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                ._M_head_impl);
      if (bVar8) {
        bVar8 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," +",2);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != p_Var7);
  }
  _Var2._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  for (p_Var4 = *(_Base_ptr *)((long)&(_Var2._M_head_impl)->injectivity_constraints + 0x18);
      p_Var4 != (_Rb_tree_node_base *)((long)&(_Var2._M_head_impl)->injectivity_constraints + 8U);
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    uVar3._M_t.
    super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
    .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl
         = (((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream).
           _M_t;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               uVar3._M_t.
               super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
               _M_head_impl," ",1);
    poVar5 = std::ostream::_M_insert<long>
                       ((long)uVar3._M_t.
                              super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                              ._M_head_impl);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," +",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t," 0\n",3);
  plVar1 = &((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_line;
  *plVar1 = *plVar1 + 1;
  return;
}

Assistant:

auto Proof::failure_due_to_pattern_bigger_than_target() -> void
{
    *_imp->proof_stream << "* failure due to the pattern being bigger than the target\n";

    for (auto & [id, _] : _imp->injectivity_constraints) {
        recover_injectivity_constraint(id);
        recover_at_least_one_constraint(id);
    }

    // we get a hall violator by adding up all of the things
    *_imp->proof_stream << "p";
    bool first = true;

    for (auto & [_, data] : _imp->at_least_one_value_constraints) {
        if (first) {
            *_imp->proof_stream << " " << get<1>(data);
            first = false;
        }
        else
            *_imp->proof_stream << " " << get<1>(data) << " +";
    }

    for (auto & [_, data] : _imp->injectivity_constraints)
        *_imp->proof_stream << " " << get<1>(data) << " +";
    *_imp->proof_stream << " 0\n";
    ++_imp->proof_line;
}